

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

logical pnga_comp_patch(Integer andim,Integer *alo,Integer *ahi,Integer bndim,Integer *blo,
                       Integer *bhi)

{
  Integer ndim;
  Integer i;
  Integer *bhi_local;
  Integer *blo_local;
  Integer bndim_local;
  Integer *ahi_local;
  Integer *alo_local;
  Integer andim_local;
  
  i = bndim;
  if (bndim < andim) {
    for (; ndim = bndim, i < andim; i = i + 1) {
      if (alo[i] != ahi[i]) {
        return 0;
      }
    }
  }
  else {
    ndim = andim;
    i = andim;
    if (andim < bndim) {
      for (; i < bndim; i = i + 1) {
        if (blo[i] != bhi[i]) {
          return 0;
        }
      }
    }
  }
  i = 0;
  while( true ) {
    if (ndim <= i) {
      return 1;
    }
    if ((alo[i] != blo[i]) || (ahi[i] != bhi[i])) break;
    i = i + 1;
  }
  return 0;
}

Assistant:

logical pnga_comp_patch(Integer andim, Integer *alo, Integer *ahi,
                          Integer bndim, Integer *blo, Integer *bhi)
{
    Integer i;
    Integer ndim;
    
    if(andim > bndim) {
        ndim = bndim;
        for(i=ndim; i<andim; i++)
            if(alo[i] != ahi[i]) return FALSE;
    }
    else if(andim < bndim) {
        ndim = andim;
        for(i=ndim; i<bndim; i++)
            if(blo[i] != bhi[i]) return FALSE;
    }
    else ndim = andim;
    
    for(i=0; i<ndim; i++)
        if((alo[i] != blo[i]) || (ahi[i] != bhi[i])) return FALSE;

    return TRUE; 
}